

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::reportOnPossibleLpDualInfeasibility(HEkkDual *this)

{
  HEkk *pHVar1;
  string lp_dual_status;
  
  pHVar1 = this->ekk_instance_;
  lp_dual_status._M_dataplus._M_p = (pointer)&lp_dual_status.field_2;
  lp_dual_status._M_string_length = 0;
  lp_dual_status.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&lp_dual_status);
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
              "LP is dual %s with dual phase 1 objective %10.4g and num / max / sum dual infeasibilities = %d / %9.4g / %9.4g\n"
              ,(pHVar1->info_).dual_objective_value,
              (pHVar1->analysis_).max_dual_phase_1_lp_dual_infeasibility,
              (pHVar1->analysis_).sum_dual_phase_1_lp_dual_infeasibility,
              lp_dual_status._M_dataplus._M_p,
              (ulong)(uint)(pHVar1->analysis_).num_dual_phase_1_lp_dual_infeasibility);
  std::__cxx11::string::~string((string *)&lp_dual_status);
  return;
}

Assistant:

void HEkkDual::reportOnPossibleLpDualInfeasibility() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexAnalysis& analysis = ekk_instance_.analysis_;
  assert(solve_phase == kSolvePhase1);
  assert(row_out == kNoRowChosen);
  //  assert(info.dual_objective_value < 0);
  assert(!info.costs_perturbed);
  std::string lp_dual_status;
  if (analysis.num_dual_phase_1_lp_dual_infeasibility) {
    lp_dual_status = "infeasible";
  } else {
    lp_dual_status = "feasible";
  }
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
              "LP is dual %s with dual phase 1 objective %10.4g and num / "
              "max / sum dual infeasibilities = %" HIGHSINT_FORMAT
              " / %9.4g / %9.4g\n",
              lp_dual_status.c_str(), info.dual_objective_value,
              analysis.num_dual_phase_1_lp_dual_infeasibility,
              analysis.max_dual_phase_1_lp_dual_infeasibility,
              analysis.sum_dual_phase_1_lp_dual_infeasibility);
}